

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3auxColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  Fts3auxCursor *p;
  int iCol_local;
  sqlite3_context *pCtx_local;
  sqlite3_vtab_cursor *pCursor_local;
  
  switch(iCol) {
  case 0:
    sqlite3_result_text(pCtx,(char *)pCursor[8].pVtab,*(int *)&pCursor[9].pVtab,
                        (_func_void_void_ptr *)0xffffffffffffffff);
    break;
  case 1:
    if (*(int *)&pCursor[0x13].pVtab == 0) {
      sqlite3_result_text(pCtx,"*",-1,(_func_void_void_ptr *)0x0);
    }
    else {
      sqlite3_result_int(pCtx,*(int *)&pCursor[0x13].pVtab + -1);
    }
    break;
  case 2:
    sqlite3_result_int64
              (pCtx,(i64)(&(pCursor[0x14].pVtab)->pModule)[(long)*(int *)&pCursor[0x13].pVtab * 2]);
    break;
  case 3:
    sqlite3_result_int64
              (pCtx,*(i64 *)(&(pCursor[0x14].pVtab)->nRef + (long)*(int *)&pCursor[0x13].pVtab * 4))
    ;
    break;
  default:
    sqlite3_result_int(pCtx,*(int *)((long)&pCursor[0x10].pVtab + 4));
  }
  return 0;
}

Assistant:

static int fts3auxColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts3auxCursor *p = (Fts3auxCursor *)pCursor;

  assert( p->isEof==0 );
  switch( iCol ){
    case 0: /* term */
      sqlite3_result_text(pCtx, p->csr.zTerm, p->csr.nTerm, SQLITE_TRANSIENT);
      break;

    case 1: /* col */
      if( p->iCol ){
        sqlite3_result_int(pCtx, p->iCol-1);
      }else{
        sqlite3_result_text(pCtx, "*", -1, SQLITE_STATIC);
      }
      break;

    case 2: /* documents */
      sqlite3_result_int64(pCtx, p->aStat[p->iCol].nDoc);
      break;

    case 3: /* occurrences */
      sqlite3_result_int64(pCtx, p->aStat[p->iCol].nOcc);
      break;

    default: /* languageid */
      assert( iCol==4 );
      sqlite3_result_int(pCtx, p->iLangid);
      break;
  }

  return SQLITE_OK;
}